

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreEarlyFragmentTestsTest::isTextureFilledWithValue
          (ImageLoadStoreEarlyFragmentTestsTest *this,GLfloat value)

{
  CallLogWrapper *this_00;
  ostringstream *this_01;
  float fVar1;
  float *pfVar2;
  GLenum err;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glGetTexImage
            (this_00,0xde1,0,0x1903,0x1406,
             (this->m_extracted_texture_data).super__Vector_base<float,_std::allocator<float>_>.
             _M_impl.super__Vector_impl_data._M_start);
  err = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(err,"GetTexImage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x2775);
  uVar3 = this->m_image_edge * this->m_image_edge;
  bVar5 = true;
  if (uVar3 != 0) {
    pfVar2 = (this->m_extracted_texture_data).super__Vector_base<float,_std::allocator<float>_>.
             _M_impl.super__Vector_impl_data._M_start;
    fVar1 = *pfVar2;
    if ((fVar1 != value) || (NAN(fVar1) || NAN(value))) {
      uVar4 = 0;
      bVar5 = false;
    }
    else {
      uVar4 = 0;
      do {
        if ((ulong)uVar3 - 1 == uVar4) {
          return true;
        }
        fVar1 = pfVar2[uVar4 + 1];
        uVar4 = uVar4 + 1;
      } while ((fVar1 == value) && (!NAN(fVar1) && !NAN(value)));
      bVar5 = uVar3 <= uVar4;
    }
    local_1a0._0_8_ =
         ((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
         m_testCtx->m_log;
    this_01 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_01);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"Texel at location ",0x12)
    ;
    std::ostream::_M_insert<unsigned_long>((ulong)this_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_01," has invalid value: ",0x14);
    std::ostream::_M_insert<double>
              ((double)(this->m_extracted_texture_data).
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar4]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," expected: ",0xb);
    std::ostream::_M_insert<double>((double)value);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_01);
    std::ios_base::~ios_base(local_128);
  }
  return bVar5;
}

Assistant:

bool isTextureFilledWithValue(GLfloat value)
	{
		glGetTexImage(GL_TEXTURE_2D, 0, GL_RED, GL_FLOAT, &m_extracted_texture_data[0]);
		GLU_EXPECT_NO_ERROR(glGetError(), "GetTexImage");

		for (GLuint i = 0; i < m_image_edge * m_image_edge; ++i)
		{
			if (value != m_extracted_texture_data[i])
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Texel at location " << i
													<< " has invalid value: " << m_extracted_texture_data[i]
													<< " expected: " << value << tcu::TestLog::EndMessage;

				return false;
			}
		}

		return true;
	}